

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# attentional.cc
# Opt level: O0

int main(int argc,char **argv)

{
  char *pcVar1;
  typed_value<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char>
  *ptVar2;
  typed_value<int,_char> *ptVar3;
  typed_value<unsigned_int,_char> *ptVar4;
  typed_value<float,_char> *ptVar5;
  typed_value<bool,_char> *ptVar6;
  size_type sVar7;
  ostream *poVar8;
  bool bVar9;
  ifstream config;
  options_description opts;
  variables_map vm;
  variables_map *in_stack_00000dd8;
  variables_map *in_stack_00000e68;
  string *in_stack_fffffffffffff538;
  int in_stack_fffffffffffff540;
  int in_stack_fffffffffffff544;
  key_type *in_stack_fffffffffffff548;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>_>_>
  *in_stack_fffffffffffff550;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>_>_>
  *this;
  variables_map *in_stack_fffffffffffff558;
  allocator *paVar10;
  undefined4 in_stack_fffffffffffff560;
  undefined4 in_stack_fffffffffffff564;
  float *in_stack_fffffffffffff568;
  typed_value<float,_char> *in_stack_fffffffffffff570;
  undefined7 in_stack_fffffffffffff618;
  undefined1 in_stack_fffffffffffff61f;
  undefined8 in_stack_fffffffffffff620;
  int style;
  options_description *in_stack_fffffffffffff628;
  char **in_stack_fffffffffffff630;
  undefined8 in_stack_fffffffffffff638;
  int argc_00;
  allocator local_641;
  string local_640 [199];
  allocator local_579;
  string local_578 [32];
  undefined4 local_558;
  byte local_553;
  byte local_552;
  allocator local_551;
  string local_550 [37];
  byte local_52b;
  byte local_52a;
  allocator local_529;
  string local_528 [37];
  byte local_503;
  byte local_502;
  allocator local_501;
  string local_500 [37];
  byte local_4db;
  byte local_4da;
  allocator local_4d9;
  string local_4d8 [37];
  byte local_4b3;
  byte local_4b2;
  allocator local_4b1;
  string local_4b0 [39];
  allocator local_489;
  string local_488 [32];
  istream local_468 [47];
  allocator local_439;
  string local_438 [32];
  options_description local_418 [527];
  allocator local_209;
  string local_208 [32];
  undefined8 local_1e8;
  undefined8 uStack_1e0;
  undefined8 uStack_1d8;
  undefined8 uStack_1d0;
  basic_parsed_options local_1c8 [44];
  undefined4 local_19c;
  undefined4 local_198;
  undefined4 local_194;
  undefined1 local_18d;
  undefined4 local_18c;
  undefined4 local_188;
  undefined4 local_184;
  uint local_180;
  uint local_17c;
  uint local_178;
  undefined4 local_174;
  undefined8 local_170 [3];
  allocator local_151;
  string local_150 [32];
  options_description local_130 [128];
  variables_map local_b0 [16];
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>_>_>
  local_a0 [3];
  char **local_10;
  int local_8;
  int local_4;
  
  argc_00 = (int)((ulong)in_stack_fffffffffffff638 >> 0x20);
  style = (int)((ulong)in_stack_fffffffffffff620 >> 0x20);
  local_4 = 0;
  dynet::initialize(&local_8,&local_10,false);
  boost::program_options::variables_map::variables_map(local_b0);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_150,"Allowed options",&local_151);
  boost::program_options::options_description::options_description
            (local_130,local_150,
             (uint)boost::program_options::options_description::m_default_line_length,
             (uint)boost::program_options::options_description::m_default_line_length >> 1);
  std::__cxx11::string::~string(local_150);
  std::allocator<char>::~allocator((allocator<char> *)&local_151);
  local_170[0] = boost::program_options::options_description::add_options();
  pcVar1 = (char *)boost::program_options::options_description_easy_init::operator()
                             ((char *)local_170,"help");
  ptVar2 = boost::program_options::value<std::__cxx11::string>();
  pcVar1 = (char *)boost::program_options::options_description_easy_init::operator()
                             (pcVar1,(value_semantic *)"config,c",(char *)ptVar2);
  ptVar2 = boost::program_options::value<std::__cxx11::string>();
  pcVar1 = (char *)boost::program_options::options_description_easy_init::operator()
                             (pcVar1,(value_semantic *)"train,t",(char *)ptVar2);
  ptVar2 = boost::program_options::value<std::__cxx11::string>();
  pcVar1 = (char *)boost::program_options::options_description_easy_init::operator()
                             (pcVar1,(value_semantic *)"devel,d",(char *)ptVar2);
  ptVar2 = boost::program_options::value<std::__cxx11::string>();
  pcVar1 = (char *)boost::program_options::options_description_easy_init::operator()
                             (pcVar1,(value_semantic *)"test,T",(char *)ptVar2);
  pcVar1 = (char *)boost::program_options::options_description_easy_init::operator()
                             (pcVar1,"rescore,r");
  boost::program_options::value<int>();
  local_174 = 0;
  ptVar3 = boost::program_options::typed_value<int,_char>::default_value
                     ((typed_value<int,_char> *)in_stack_fffffffffffff570,
                      (int *)in_stack_fffffffffffff568);
  pcVar1 = (char *)boost::program_options::options_description_easy_init::operator()
                             (pcVar1,(value_semantic *)"beam,b",(char *)ptVar3);
  ptVar2 = boost::program_options::value<std::__cxx11::string>();
  pcVar1 = (char *)boost::program_options::options_description_easy_init::operator()
                             (pcVar1,(value_semantic *)"kbest,K",(char *)ptVar2);
  ptVar2 = boost::program_options::value<std::__cxx11::string>();
  pcVar1 = (char *)boost::program_options::options_description_easy_init::operator()
                             (pcVar1,(value_semantic *)"initialise,i",(char *)ptVar2);
  ptVar2 = boost::program_options::value<std::__cxx11::string>();
  pcVar1 = (char *)boost::program_options::options_description_easy_init::operator()
                             (pcVar1,(value_semantic *)"parameters,p",(char *)ptVar2);
  boost::program_options::value<int>();
  local_178 = LAYERS;
  ptVar3 = boost::program_options::typed_value<int,_char>::default_value
                     ((typed_value<int,_char> *)in_stack_fffffffffffff570,
                      (int *)in_stack_fffffffffffff568);
  pcVar1 = (char *)boost::program_options::options_description_easy_init::operator()
                             (pcVar1,(value_semantic *)"layers,l",(char *)ptVar3);
  boost::program_options::value<int>();
  local_17c = ALIGN_DIM;
  ptVar3 = boost::program_options::typed_value<int,_char>::default_value
                     ((typed_value<int,_char> *)in_stack_fffffffffffff570,
                      (int *)in_stack_fffffffffffff568);
  pcVar1 = (char *)boost::program_options::options_description_easy_init::operator()
                             (pcVar1,(value_semantic *)"align,a",(char *)ptVar3);
  boost::program_options::value<int>();
  local_180 = HIDDEN_DIM;
  ptVar3 = boost::program_options::typed_value<int,_char>::default_value
                     ((typed_value<int,_char> *)in_stack_fffffffffffff570,
                      (int *)in_stack_fffffffffffff568);
  pcVar1 = (char *)boost::program_options::options_description_easy_init::operator()
                             (pcVar1,(value_semantic *)"hidden,h",(char *)ptVar3);
  boost::program_options::value<unsigned_int>();
  local_184 = 0;
  ptVar4 = boost::program_options::typed_value<unsigned_int,_char>::default_value
                     ((typed_value<unsigned_int,_char> *)in_stack_fffffffffffff570,
                      (uint *)in_stack_fffffffffffff568);
  pcVar1 = (char *)boost::program_options::options_description_easy_init::operator()
                             (pcVar1,(value_semantic *)"sgd_trainer",(char *)ptVar4);
  boost::program_options::value<float>();
  local_188 = 0x3c23d70a;
  ptVar5 = boost::program_options::typed_value<float,_char>::default_value
                     (in_stack_fffffffffffff570,in_stack_fffffffffffff568);
  pcVar1 = (char *)boost::program_options::options_description_easy_init::operator()
                             (pcVar1,(value_semantic *)"lr_eta",(char *)ptVar5);
  boost::program_options::value<float>();
  local_18c = 0x40000000;
  ptVar5 = boost::program_options::typed_value<float,_char>::default_value
                     (in_stack_fffffffffffff570,in_stack_fffffffffffff568);
  pcVar1 = (char *)boost::program_options::options_description_easy_init::operator()
                             (pcVar1,(value_semantic *)"lr_eta_decay",(char *)ptVar5);
  boost::program_options::value<bool>();
  local_18d = 1;
  ptVar6 = boost::program_options::typed_value<bool,_char>::default_value
                     ((typed_value<bool,_char> *)in_stack_fffffffffffff570,
                      (bool *)in_stack_fffffffffffff568);
  pcVar1 = (char *)boost::program_options::options_description_easy_init::operator()
                             (pcVar1,(value_semantic *)"sparse_updates",(char *)ptVar6);
  boost::program_options::value<int>();
  local_194 = 100;
  ptVar3 = boost::program_options::typed_value<int,_char>::default_value
                     ((typed_value<int,_char> *)in_stack_fffffffffffff570,
                      (int *)in_stack_fffffffffffff568);
  pcVar1 = (char *)boost::program_options::options_description_easy_init::operator()
                             (pcVar1,(value_semantic *)"topk,k",(char *)ptVar3);
  boost::program_options::value<int>();
  local_198 = 0x32;
  ptVar3 = boost::program_options::typed_value<int,_char>::default_value
                     ((typed_value<int,_char> *)in_stack_fffffffffffff570,
                      (int *)in_stack_fffffffffffff568);
  pcVar1 = (char *)boost::program_options::options_description_easy_init::operator()
                             (pcVar1,(value_semantic *)"epochs,e",(char *)ptVar3);
  pcVar1 = (char *)boost::program_options::options_description_easy_init::operator()(pcVar1,"gru");
  pcVar1 = (char *)boost::program_options::options_description_easy_init::operator()(pcVar1,"lstm");
  pcVar1 = (char *)boost::program_options::options_description_easy_init::operator()
                             (pcVar1,"bidirectional");
  pcVar1 = (char *)boost::program_options::options_description_easy_init::operator()(pcVar1,"giza");
  pcVar1 = (char *)boost::program_options::options_description_easy_init::operator()
                             (pcVar1,"gz-position");
  pcVar1 = (char *)boost::program_options::options_description_easy_init::operator()
                             (pcVar1,"gz-markov");
  pcVar1 = (char *)boost::program_options::options_description_easy_init::operator()
                             (pcVar1,"gz-fertility");
  pcVar1 = (char *)boost::program_options::options_description_easy_init::operator()
                             (pcVar1,"curriculum");
  pcVar1 = (char *)boost::program_options::options_description_easy_init::operator()(pcVar1,"swap");
  pcVar1 = (char *)boost::program_options::options_description_easy_init::operator()
                             (pcVar1,"document,D");
  boost::program_options::value<float>();
  local_19c = 0;
  ptVar5 = boost::program_options::typed_value<float,_char>::default_value
                     (in_stack_fffffffffffff570,in_stack_fffffffffffff568);
  pcVar1 = (char *)boost::program_options::options_description_easy_init::operator()
                             (pcVar1,(value_semantic *)"coverage,C",(char *)ptVar5);
  pcVar1 = (char *)boost::program_options::options_description_easy_init::operator()
                             (pcVar1,"fertility,f");
  pcVar1 = (char *)boost::program_options::options_description_easy_init::operator()
                             (pcVar1,"fert-stats,F");
  pcVar1 = (char *)boost::program_options::options_description_easy_init::operator()
                             (pcVar1,"display");
  boost::program_options::options_description_easy_init::operator()(pcVar1,"verbose,v");
  local_1e8 = 0;
  uStack_1e0 = 0;
  uStack_1d8 = 0;
  uStack_1d0 = 0;
  boost::
  function1<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
  ::function1((function1<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
               *)0x168362);
  boost::program_options::parse_command_line<char>
            (argc_00,in_stack_fffffffffffff630,in_stack_fffffffffffff628,style,
             (function1<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
              *)CONCAT17(in_stack_fffffffffffff61f,in_stack_fffffffffffff618));
  boost::program_options::store(local_1c8,local_b0,false);
  boost::program_options::basic_parsed_options<char>::~basic_parsed_options
            ((basic_parsed_options<char> *)0x1683bb);
  boost::
  function1<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
  ::~function1((function1<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
                *)0x1683c8);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_208,"config",&local_209);
  sVar7 = std::
          map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>_>_>
          ::count(in_stack_fffffffffffff550,in_stack_fffffffffffff548);
  std::__cxx11::string::~string(local_208);
  std::allocator<char>::~allocator((allocator<char> *)&local_209);
  if (sVar7 != 0) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_438,"config",&local_439);
    boost::program_options::variables_map::operator[]
              ((variables_map *)CONCAT44(in_stack_fffffffffffff544,in_stack_fffffffffffff540),
               in_stack_fffffffffffff538);
    boost::program_options::variable_value::as<std::__cxx11::string>((variable_value *)0x1684b5);
    pcVar1 = (char *)std::__cxx11::string::c_str();
    std::ifstream::ifstream(local_418,pcVar1,_S_in);
    std::__cxx11::string::~string(local_438);
    std::allocator<char>::~allocator((allocator<char> *)&local_439);
    boost::program_options::parse_config_file<char>(local_468,local_418,SUB81(local_130,0));
    boost::program_options::store(local_468,local_b0,false);
    boost::program_options::basic_parsed_options<char>::~basic_parsed_options
              ((basic_parsed_options<char> *)0x168544);
    std::ifstream::~ifstream(local_418);
  }
  boost::program_options::notify(local_b0);
  paVar10 = &local_489;
  std::allocator<char>::allocator();
  local_4b2 = 0;
  local_4b3 = 0;
  local_4da = 0;
  local_4db = 0;
  local_502 = 0;
  local_503 = 0;
  local_52a = 0;
  local_52b = 0;
  local_552 = 0;
  local_553 = 0;
  std::__cxx11::string::string(local_488,"help",paVar10);
  sVar7 = std::
          map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>_>_>
          ::count(in_stack_fffffffffffff550,in_stack_fffffffffffff548);
  bVar9 = true;
  if (sVar7 == 0) {
    std::allocator<char>::allocator();
    local_4b2 = 1;
    std::__cxx11::string::string(local_4b0,"train",&local_4b1);
    local_4b3 = 1;
    sVar7 = std::
            map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>_>_>
            ::count(in_stack_fffffffffffff550,in_stack_fffffffffffff548);
    bVar9 = true;
    if (sVar7 == 1) {
      std::allocator<char>::allocator();
      local_4da = 1;
      std::__cxx11::string::string(local_4d8,"devel",&local_4d9);
      local_4db = 1;
      sVar7 = std::
              map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>_>_>
              ::count(in_stack_fffffffffffff550,in_stack_fffffffffffff548);
      bVar9 = false;
      if (sVar7 != 1) {
        std::allocator<char>::allocator();
        local_502 = 1;
        std::__cxx11::string::string(local_500,"test",&local_501);
        local_503 = 1;
        sVar7 = std::
                map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>_>_>
                ::count(in_stack_fffffffffffff550,in_stack_fffffffffffff548);
        bVar9 = true;
        if (sVar7 != 0) {
          std::allocator<char>::allocator();
          local_52a = 1;
          std::__cxx11::string::string(local_528,"kbest",&local_529);
          local_52b = 1;
          sVar7 = std::
                  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>_>_>
                  ::count(in_stack_fffffffffffff550,in_stack_fffffffffffff548);
          bVar9 = true;
          if (sVar7 != 0) {
            std::allocator<char>::allocator();
            local_552 = 1;
            std::__cxx11::string::string(local_550,"fert-stats",&local_551);
            local_553 = 1;
            sVar7 = std::
                    map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>_>_>
                    ::count(in_stack_fffffffffffff550,in_stack_fffffffffffff548);
            bVar9 = sVar7 == 0;
          }
        }
        bVar9 = (bool)(bVar9 ^ 1);
      }
    }
  }
  if ((local_553 & 1) != 0) {
    std::__cxx11::string::~string(local_550);
  }
  if ((local_552 & 1) != 0) {
    std::allocator<char>::~allocator((allocator<char> *)&local_551);
  }
  if ((local_52b & 1) != 0) {
    std::__cxx11::string::~string(local_528);
  }
  if ((local_52a & 1) != 0) {
    std::allocator<char>::~allocator((allocator<char> *)&local_529);
  }
  if ((local_503 & 1) != 0) {
    std::__cxx11::string::~string(local_500);
  }
  if ((local_502 & 1) != 0) {
    std::allocator<char>::~allocator((allocator<char> *)&local_501);
  }
  if ((local_4db & 1) != 0) {
    std::__cxx11::string::~string(local_4d8);
  }
  if ((local_4da & 1) != 0) {
    std::allocator<char>::~allocator((allocator<char> *)&local_4d9);
  }
  if ((local_4b3 & 1) != 0) {
    std::__cxx11::string::~string(local_4b0);
  }
  if ((local_4b2 & 1) != 0) {
    std::allocator<char>::~allocator((allocator<char> *)&local_4b1);
  }
  std::__cxx11::string::~string(local_488);
  std::allocator<char>::~allocator((allocator<char> *)&local_489);
  if (bVar9) {
    poVar8 = (ostream *)boost::program_options::operator<<((ostream *)&std::cout,local_130);
    std::operator<<(poVar8,"\n");
    local_4 = 1;
  }
  else {
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_578,"lstm",&local_579);
    sVar7 = std::
            map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>_>_>
            ::count(in_stack_fffffffffffff550,in_stack_fffffffffffff548);
    std::__cxx11::string::~string(local_578);
    std::allocator<char>::~allocator((allocator<char> *)&local_579);
    if (sVar7 == 0) {
      this = local_a0;
      paVar10 = &local_641;
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_640,"gru",paVar10);
      sVar7 = std::
              map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>_>_>
              ::count(this,in_stack_fffffffffffff548);
      std::__cxx11::string::~string(local_640);
      std::allocator<char>::~allocator((allocator<char> *)&local_641);
      if (sVar7 == 0) {
        boost::program_options::variables_map::variables_map
                  ((variables_map *)CONCAT44(in_stack_fffffffffffff564,in_stack_fffffffffffff560),
                   (variables_map *)paVar10);
        in_stack_fffffffffffff540 = main_body<dynet::SimpleRNNBuilder>(in_stack_00000dd8);
        local_4 = in_stack_fffffffffffff540;
        boost::program_options::variables_map::~variables_map
                  ((variables_map *)CONCAT44(in_stack_fffffffffffff544,in_stack_fffffffffffff540));
      }
      else {
        boost::program_options::variables_map::variables_map
                  ((variables_map *)CONCAT44(in_stack_fffffffffffff564,in_stack_fffffffffffff560),
                   (variables_map *)paVar10);
        in_stack_fffffffffffff544 = main_body<dynet::GRUBuilder>(in_stack_00000dd8);
        local_4 = in_stack_fffffffffffff544;
        boost::program_options::variables_map::~variables_map
                  ((variables_map *)CONCAT44(in_stack_fffffffffffff544,in_stack_fffffffffffff540));
      }
    }
    else {
      boost::program_options::variables_map::variables_map
                ((variables_map *)CONCAT44(in_stack_fffffffffffff564,in_stack_fffffffffffff560),
                 in_stack_fffffffffffff558);
      local_4 = main_body<dynet::LSTMBuilder>(in_stack_00000e68);
      boost::program_options::variables_map::~variables_map
                ((variables_map *)CONCAT44(in_stack_fffffffffffff544,in_stack_fffffffffffff540));
    }
  }
  local_558 = 1;
  boost::program_options::options_description::~options_description
            ((options_description *)CONCAT44(in_stack_fffffffffffff544,in_stack_fffffffffffff540));
  boost::program_options::variables_map::~variables_map
            ((variables_map *)CONCAT44(in_stack_fffffffffffff544,in_stack_fffffffffffff540));
  return local_4;
}

Assistant:

int main(int argc, char** argv) {
    dynet::initialize(argc, argv);

    // command line processing
    variables_map vm; 
    options_description opts("Allowed options");
    opts.add_options()
        ("help", "print help message")
        ("config,c", value<string>(), "config file specifying additional command line options")
        ("train,t", value<string>(), "file containing training sentences, with "
            "each line consisting of source ||| target.")
        ("devel,d", value<string>(), "file containing development sentences.")
        ("test,T", value<string>(), "file containing testing sentences")
        ("rescore,r", "rescore (source, target) pairs in testing, default: translate source only")
        ("beam,b", value<int>()->default_value(0), "size of beam in decoding; 0=greedy")
        ("kbest,K", value<string>(), "test on kbest inputs using mononlingual Markov model")
        ("initialise,i", value<string>(), "load initial parameters from file")
        ("parameters,p", value<string>(), "save best parameters to this file")
        ("layers,l", value<int>()->default_value(LAYERS), "use <num> layers for RNN components")
        ("align,a", value<int>()->default_value(ALIGN_DIM), "use <num> dimensions for alignment projection")
        ("hidden,h", value<int>()->default_value(HIDDEN_DIM), "use <num> dimensions for recurrent hidden states")
	("sgd_trainer", value<unsigned>()->default_value(0), "use specific SGD trainer (0: vanilla SGD; 1: momentum SGD; 2: Adagrad; 3: AdaDelta; 4: Adam)")
	("lr_eta", value<float>()->default_value(0.01f), "SGD learning rate value (e.g., 0.01 for simple SGD trainer)")
        ("lr_eta_decay", value<float>()->default_value(2.0f), "SGD learning rate decay value")
	("sparse_updates", value<bool>()->default_value(true), "enable/disable sparse update(s) for lookup parameter(s)")
        ("topk,k", value<int>()->default_value(100), "use <num> top kbest entries, used with --kbest")
        ("epochs,e", value<int>()->default_value(50), "maximum number of training epochs")
        ("gru", "use Gated Recurrent Unit (GRU) for recurrent structure; default RNN")
        ("lstm", "use Long Short Term Memory (GRU) for recurrent structure; default RNN")
        ("bidirectional", "use bidirectional recurrent hidden states as source embeddings, rather than word embeddings")
        ("giza", "use GIZA++ style features in attentional components (corresponds to all of the 'gz' options)")
        ("gz-position", "use GIZA++ positional index features")
        ("gz-markov", "use GIZA++ markov context features")
        ("gz-fertility", "use GIZA++ fertility type features")
        ("curriculum", "use 'curriculum' style learning, focusing on easy problems in earlier epochs")
        ("swap", "swap roles of source and target, i.e., learn p(source|target)")
        ("document,D", "use previous sentence as document context; requires document id prefix in input files")
        ("coverage,C", value<float>()->default_value(0.0f), "impose alignment coverage penalty in training, with given coefficient")
        ("fertility,f", "learn Normal model of word fertility values")
        ("fert-stats,F", "display computed fertility values on the development set")
        ("display", "just display alignments instead of training or decoding")
        ("verbose,v", "be extremely chatty")
    ;
    store(parse_command_line(argc, argv, opts), vm); 
    if (vm.count("config") > 0)
    {
        ifstream config(vm["config"].as<string>().c_str());
        store(parse_config_file(config, opts), vm); 
    }
    notify(vm);
    
    if (vm.count("help") || vm.count("train") != 1 || (vm.count("devel") != 1 && !(vm.count("test") == 0 || vm.count("kbest") == 0 || vm.count("fert-stats") == 0))) {
        cout << opts << "\n";
        return 1;
    }

    if (vm.count("lstm"))
	return main_body<LSTMBuilder>(vm);
    else if (vm.count("gru"))
	return main_body<GRUBuilder>(vm);
    else
	return main_body<SimpleRNNBuilder>(vm);
}